

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_escape_sequence_abi_cxx11_
          (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  const_iterator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  bool bVar1;
  reference pcVar2;
  value_type *pvVar3;
  uint *loc_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_11;
  bool bVar4;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b38;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_ad0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a70;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_9d0;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_998;
  char *local_978;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_96b;
  undefined1 local_96a;
  allocator<char> local_969;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  iterator local_940;
  size_type local_938;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_930;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_912;
  undefined1 local_911;
  source_location local_910;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8c0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b8;
  iterator local_848;
  size_type local_840;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_838;
  allocator<char> local_819;
  string local_818;
  undefined1 local_7f8 [8];
  string msg;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7b2;
  undefined1 local_7b1;
  source_location local_7b0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_760;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_758;
  iterator local_6e8;
  size_type local_6e0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6d8;
  allocator<char> local_6b9;
  string local_6b8;
  string local_698;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_678;
  string local_658;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_638;
  undefined1 local_618 [8];
  result<toml::detail::region,_toml::detail::none_t> token_1;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5aa;
  undefined1 local_5a9;
  source_location local_5a8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_558;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  iterator local_4e0;
  size_type local_4d8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d0;
  allocator<char> local_4b1;
  string local_4b0;
  string local_490;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  undefined4 local_44c;
  string local_448;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  undefined1 local_408 [8];
  result<toml::detail::region,_toml::detail::none_t> token;
  string local_3b0 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  allocator<char> local_369;
  string local_368 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  allocator<char> local_321;
  string local_320 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  allocator<char> local_2d9;
  string local_2d8 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  allocator<char> local_291;
  string local_290 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  allocator<char> local_249;
  string local_248 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  allocator<char> local_201;
  string local_200 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_192;
  undefined1 local_191;
  source_location local_190;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  iterator local_c8;
  size_type local_c0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  allocator<char> local_89;
  string local_88;
  string local_68;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48
  ;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  location *loc_local;
  
  first._M_current = (char *)this;
  local_20._M_current = (char *)location::iter((location *)this);
  local_28._M_current = (char *)location::end(first._M_current);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_28);
  bVar4 = true;
  if (!bVar1) {
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_20);
    bVar4 = *pcVar2 != '\\';
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"toml::parse_escape_sequence: ",&local_89);
    local_191 = 1;
    local_140 = &local_138;
    source_location::source_location(&local_190,(location *)first._M_current);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[38],_true>
              (&local_138,&local_190,(char (*) [38])"the next token is not a backslash \"\\\"");
    local_191 = 0;
    local_c8 = &local_138;
    local_c0 = 1;
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_192);
    __l_03._M_len = local_c0;
    __l_03._M_array = local_c8;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_b8,__l_03,&local_192);
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1b8);
    format_underline(&local_68,&local_88,&local_b8,&local_1b8,false);
    err<std::__cxx11::string>(&local_48,(toml *)&local_68,v);
    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_48);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_b8);
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_192);
    local_9d0 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c8;
    do {
      local_9d0 = local_9d0 + -1;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_9d0);
    } while (local_9d0 != &local_138);
    source_location::~source_location(&local_190);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  else {
    location::advance((location *)first._M_current,1);
    local_1c0._M_current = (char *)location::iter(first._M_current);
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_1c0);
    loc_00 = &switchD_00155f2f::switchdataD_00279130;
    switch(*pcVar2) {
    case '\"':
      location::advance((location *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_248,"\"",&local_249);
      ok<std::__cxx11::string>(&local_228,(toml *)local_248,v_01);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_228);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_228);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator(&local_249);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,"parse_escape_sequence: unknown escape sequence appeared.",
                 &local_819);
      local_911 = 1;
      local_8c0 = &local_8b8;
      source_location::source_location(&local_910,(location *)first._M_current);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[64],_true>
                (&local_8b8,&local_910,
                 (char (*) [64])"escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx")
      ;
      local_911 = 0;
      local_848 = &local_8b8;
      local_840 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_912);
      __l_00._M_len = local_840;
      __l_00._M_array = local_848;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_838,__l_00,&local_912);
      local_96a = 1;
      local_968 = &local_960;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,
                 "if you want to write backslash as just one backslash, use literal string like: regex    = \'<\\i\\c*\\s*>\'"
                 ,&local_969);
      local_96a = 0;
      local_940 = &local_960;
      local_938 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_96b);
      __l._M_len = local_938;
      __l._M_array = local_940;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_930,__l,&local_96b);
      format_underline((string *)local_7f8,&local_818,&local_838,&local_930,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_930);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_96b);
      local_b38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_940;
      do {
        local_b38 = local_b38 + -1;
        std::__cxx11::string::~string((string *)local_b38);
      } while (local_b38 != &local_960);
      std::allocator<char>::~allocator(&local_969);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_838);
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator(&local_912);
      local_b50 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_848;
      do {
        local_b50 = local_b50 + -1;
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_b50);
      } while (local_b50 != &local_8b8);
      source_location::~source_location(&local_910);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      local_978 = local_20._M_current;
      location::reset((location *)first._M_current,(const_iterator)local_20._M_current);
      err<std::__cxx11::string_const&>(&local_998,(toml *)local_7f8,v_11);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_998);
      failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~failure(&local_998);
      local_44c = 1;
      std::__cxx11::string::~string((string *)local_7f8);
      break;
    case 'U':
      sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>
      ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_618,
               (location *)first._M_current);
      bVar4 = toml::result::operator_cast_to_bool((result *)local_618);
      if (bVar4) {
        pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                           ((result<toml::detail::region,_toml::detail::none_t> *)local_618);
        read_utf8_codepoint_abi_cxx11_
                  (&local_658,(detail *)pvVar3,(region *)first._M_current,(location *)loc_00);
        ok<std::__cxx11::string>(&local_638,(toml *)&local_658,v_09);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_638);
        success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~success(&local_638);
        std::__cxx11::string::~string((string *)&local_658);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,
                   "parse_escape_sequence: invalid token found in UTF-8 codepoint Uxxxxxxxx",
                   &local_6b9);
        local_7b1 = 1;
        local_760 = &local_758;
        source_location::source_location(&local_7b0,(location *)first._M_current);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[5],_true>
                  (&local_758,&local_7b0,(char (*) [5])0x280c90);
        local_7b1 = 0;
        local_6e8 = &local_758;
        local_6e0 = 1;
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_7b2);
        __l_01._M_len = local_6e0;
        __l_01._M_array = local_6e8;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_6d8,__l_01,&local_7b2);
        msg.field_2._8_8_ = 0;
        this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&msg.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_01);
        format_underline(&local_698,&local_6b8,&local_6d8,this_01,false);
        err<std::__cxx11::string>(&local_678,(toml *)&local_698,v_10);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_678);
        failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~failure(&local_678);
        std::__cxx11::string::~string((string *)&local_698);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&msg.field_2 + 8));
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_6d8);
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator(&local_7b2);
        local_ad0 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_6e8;
        do {
          local_ad0 = local_ad0 + -1;
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(local_ad0);
        } while (local_ad0 != &local_758);
        source_location::~source_location(&local_7b0);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::allocator<char>::~allocator(&local_6b9);
      }
      local_44c = 1;
      result<toml::detail::region,_toml::detail::none_t>::~result
                ((result<toml::detail::region,_toml::detail::none_t> *)local_618);
      break;
    case '\\':
      location::advance((location *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_200,"\\",&local_201);
      ok<std::__cxx11::string>(&local_1e0,(toml *)local_200,v_00);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_1e0);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_1e0);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator(&local_201);
      break;
    case 'b':
      location::advance((location *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_290,"\b",&local_291);
      ok<std::__cxx11::string>(&local_270,(toml *)local_290,v_02);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_270);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_270);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator(&local_291);
      break;
    case 'f':
      location::advance((location *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_368,"\f",&local_369);
      ok<std::__cxx11::string>(&local_348,(toml *)local_368,v_05);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_348);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_348);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator(&local_369);
      break;
    case 'n':
      location::advance((location *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_320,"\n",&local_321);
      ok<std::__cxx11::string>(&local_300,(toml *)local_320,v_04);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_300);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_300);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator(&local_321);
      break;
    case 'r':
      location::advance((location *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_3b0,"\r",
                 (allocator<char> *)((long)&token.field_1.succ.value.last_._M_current + 7));
      ok<std::__cxx11::string>(&local_390,(toml *)local_3b0,v_06);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_390);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_390);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&token.field_1.succ.value.last_._M_current + 7));
      break;
    case 't':
      location::advance((location *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2d8,"\t",&local_2d9);
      ok<std::__cxx11::string>(&local_2b8,(toml *)local_2d8,v_03);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_2b8);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_2b8);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      break;
    case 'u':
      sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>
      ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_408,
               (location *)first._M_current);
      bVar4 = toml::result::operator_cast_to_bool((result *)local_408);
      if (bVar4) {
        pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                           ((result<toml::detail::region,_toml::detail::none_t> *)local_408);
        read_utf8_codepoint_abi_cxx11_
                  (&local_448,(detail *)pvVar3,(region *)first._M_current,(location *)loc_00);
        ok<std::__cxx11::string>(&local_428,(toml *)&local_448,v_07);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_428);
        success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~success(&local_428);
        std::__cxx11::string::~string((string *)&local_448);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,
                   "parse_escape_sequence: invalid token found in UTF-8 codepoint uXXXX.",&local_4b1
                  );
        local_5a9 = 1;
        local_558 = &local_550;
        source_location::source_location(&local_5a8,(location *)first._M_current);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[5],_true>
                  (&local_550,&local_5a8,(char (*) [5])0x280c90);
        local_5a9 = 0;
        local_4e0 = &local_550;
        local_4d8 = 1;
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_5aa);
        __l_02._M_len = local_4d8;
        __l_02._M_array = local_4e0;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_4d0,__l_02,&local_5aa);
        token_1.field_1.succ.value.last_._M_current = (const_iterator)(char *)0x0;
        this_00 = &token_1.field_1.succ.value.last_;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
        format_underline(&local_490,&local_4b0,&local_4d0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00,false);
        err<std::__cxx11::string>(&local_470,(toml *)&local_490,v_08);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_470);
        failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~failure(&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&token_1.field_1.succ.value.last_);
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_4d0);
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator(&local_5aa);
        local_a70 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_4e0;
        do {
          local_a70 = local_a70 + -1;
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(local_a70);
        } while (local_a70 != &local_550);
        source_location::~source_location(&local_5a8);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator(&local_4b1);
      }
      local_44c = 1;
      result<toml::detail::region,_toml::detail::none_t>::~result
                ((result<toml::detail::region,_toml::detail::none_t> *)local_408);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::string, std::string> parse_escape_sequence(location& loc)
{
    const auto first = loc.iter();
    if(first == loc.end() || *first != '\\')
    {
        return err(format_underline("toml::parse_escape_sequence: ", {{
            source_location(loc), "the next token is not a backslash \"\\\""}}));
    }
    loc.advance();
    switch(*loc.iter())
    {
        case '\\':{loc.advance(); return ok(std::string("\\"));}
        case '"' :{loc.advance(); return ok(std::string("\""));}
        case 'b' :{loc.advance(); return ok(std::string("\b"));}
        case 't' :{loc.advance(); return ok(std::string("\t"));}
        case 'n' :{loc.advance(); return ok(std::string("\n"));}
        case 'f' :{loc.advance(); return ok(std::string("\f"));}
        case 'r' :{loc.advance(); return ok(std::string("\r"));}
#ifdef TOML11_USE_UNRELEASED_TOML_FEATURES
        case 'e' :{loc.advance(); return ok(std::string("\x1b"));} // ESC
#endif
        case 'u' :
        {
            if(const auto token = lex_escape_unicode_short::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint uXXXX.",
                           {{source_location(loc), "here"}}));
            }
        }
        case 'U':
        {
            if(const auto token = lex_escape_unicode_long::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint Uxxxxxxxx",
                           {{source_location(loc), "here"}}));
            }
        }
    }

    const auto msg = format_underline("parse_escape_sequence: "
           "unknown escape sequence appeared.", {{source_location(loc),
           "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx"}},
           /* Hints = */{"if you want to write backslash as just one backslash, "
           "use literal string like: regex    = '<\\i\\c*\\s*>'"});
    loc.reset(first);
    return err(msg);
}